

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_csr.c
# Opt level: O0

int mbedtls_x509_csr_parse(mbedtls_x509_csr *csr,uchar *buf,size_t buflen)

{
  undefined1 local_50 [8];
  mbedtls_pem_context pem;
  size_t use_len;
  int ret;
  size_t buflen_local;
  uchar *buf_local;
  mbedtls_x509_csr *csr_local;
  
  if (((csr == (mbedtls_x509_csr *)0x0) || (buf == (uchar *)0x0)) || (buflen == 0)) {
    csr_local._4_4_ = -0x2800;
  }
  else {
    mbedtls_pem_init((mbedtls_pem_context *)local_50);
    if (buf[buflen - 1] == '\0') {
      use_len._4_4_ =
           mbedtls_pem_read_buffer
                     ((mbedtls_pem_context *)local_50,"-----BEGIN CERTIFICATE REQUEST-----",
                      "-----END CERTIFICATE REQUEST-----",buf,(uchar *)0x0,0,(size_t *)&pem.info);
    }
    else {
      use_len._4_4_ = -0x1080;
    }
    if (use_len._4_4_ == 0) {
      csr_local._4_4_ = mbedtls_x509_csr_parse_der(csr,(uchar *)local_50,(size_t)pem.buf);
      if (csr_local._4_4_ == 0) {
        mbedtls_pem_free((mbedtls_pem_context *)local_50);
        csr_local._4_4_ = 0;
      }
    }
    else if (use_len._4_4_ == -0x1080) {
      csr_local._4_4_ = mbedtls_x509_csr_parse_der(csr,buf,buflen);
    }
    else {
      mbedtls_pem_free((mbedtls_pem_context *)local_50);
      csr_local._4_4_ = use_len._4_4_;
    }
  }
  return csr_local._4_4_;
}

Assistant:

int mbedtls_x509_csr_parse( mbedtls_x509_csr *csr, const unsigned char *buf, size_t buflen )
{
#if defined(MBEDTLS_PEM_PARSE_C)
    int ret;
    size_t use_len;
    mbedtls_pem_context pem;
#endif

    /*
     * Check for valid input
     */
    if( csr == NULL || buf == NULL || buflen == 0 )
        return( MBEDTLS_ERR_X509_BAD_INPUT_DATA );

#if defined(MBEDTLS_PEM_PARSE_C)
    mbedtls_pem_init( &pem );

    /* Avoid calling mbedtls_pem_read_buffer() on non-null-terminated string */
    if( buf[buflen - 1] != '\0' )
        ret = MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    else
        ret = mbedtls_pem_read_buffer( &pem,
                               "-----BEGIN CERTIFICATE REQUEST-----",
                               "-----END CERTIFICATE REQUEST-----",
                               buf, NULL, 0, &use_len );

    if( ret == 0 )
    {
        /*
         * Was PEM encoded, parse the result
         */
        if( ( ret = mbedtls_x509_csr_parse_der( csr, pem.buf, pem.buflen ) ) != 0 )
            return( ret );

        mbedtls_pem_free( &pem );
        return( 0 );
    }
    else if( ret != MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT )
    {
        mbedtls_pem_free( &pem );
        return( ret );
    }
    else
#endif /* MBEDTLS_PEM_PARSE_C */
    return( mbedtls_x509_csr_parse_der( csr, buf, buflen ) );
}